

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

uncertain_measurement
units::uncertain_measurement_from_string(string *measurement_string,uint64_t match_flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data *puVar2;
  pointer pcVar3;
  uncertain_measurement uVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  unit uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char *__s;
  bool bVar13;
  float fVar14;
  unit_data uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p1;
  measurement m2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p2;
  measurement m1;
  string local_198;
  unit local_178;
  unit local_170;
  uncertain_measurement local_168;
  unit local_150;
  precise_measurement local_148;
  measurement local_128;
  precise_measurement local_118;
  measurement local_f8;
  precise_measurement local_e8;
  unit local_d0;
  size_type local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  unit local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  unit local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  unit local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  unit local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (measurement_string->_M_string_length == 0) {
    local_168.value_ = 0.0;
    local_168.uncertainty_ = 0.0;
    local_168.units_.multiplier_ = 1.0;
    local_168.units_.base_units_ = (unit_data)0x0;
    goto LAB_001768a1;
  }
  __s = "+/-";
  bVar13 = false;
  local_170 = (unit)match_flags;
  lVar7 = std::__cxx11::string::find((char *)measurement_string,0x18d38b,0);
  if (lVar7 == -1) {
    lVar7 = 0;
    do {
      bVar13 = lVar7 == 0x40;
      if (bVar13) goto LAB_0017673a;
      __s = *(char **)((long)uncertain_measurement_from_string::pmsequences._M_elems + lVar7 + 8);
      strlen(__s);
      lVar8 = std::__cxx11::string::find((char *)measurement_string,(ulong)__s,0);
      lVar7 = lVar7 + 8;
    } while (lVar8 == -1);
  }
  std::__cxx11::string::substr((ulong)&local_148,(ulong)measurement_string);
  local_70 = (unit)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_148.value_,
             (undefined1 *)((long)local_148.units_.multiplier_ + (long)local_148.value_));
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  if (local_70 == (unit)&local_60) {
    local_198.field_2._8_8_ = local_60._8_8_;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_70;
  }
  local_198.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_198.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_198._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70 = (unit)&local_60;
  measurement_from_string(&local_118,&local_198,(uint64_t)local_170);
  uVar5 = local_118.units_._8_8_;
  fVar14 = SUB84(local_118.units_.multiplier_,0);
  uVar15 = SUB84((ulong)local_118.units_.multiplier_ >> 0x20,0);
  local_f8.value_ = local_118.value_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    local_178 = (unit)local_118.value_;
    local_150 = (unit)local_118.units_.multiplier_;
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    fVar14 = local_150.multiplier_;
    uVar15 = local_150.base_units_;
    local_f8.value_ = (double)local_178;
  }
  local_f8.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar15,fVar14) | uVar5 << 0x20);
  if (local_70 != (unit)&local_60) {
    operator_delete((void *)local_70,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  strlen(__s);
  std::__cxx11::string::substr((ulong)&local_118,(ulong)measurement_string);
  local_90 = (unit)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_118.value_,
             (undefined1 *)((long)local_118.units_.multiplier_ + (long)local_118.value_));
  if (local_90 == (unit)&local_80) {
    local_198.field_2._8_8_ = local_80._8_8_;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_90;
  }
  local_198.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
  local_198.field_2._M_local_buf[0] = local_80._M_local_buf[0];
  local_198._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = (unit)&local_80;
  measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
  uVar5 = local_e8.units_._8_8_;
  fVar14 = SUB84(local_e8.units_.multiplier_,0);
  uVar15 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
  local_128.value_ = local_e8.value_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    local_178 = (unit)local_e8.value_;
    local_150 = (unit)local_e8.units_.multiplier_;
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    fVar14 = local_150.multiplier_;
    uVar15 = local_150.base_units_;
    local_128.value_ = (double)local_178;
  }
  local_128.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar15,fVar14) | uVar5 << 0x20);
  if (local_90 != (unit)&local_80) {
    operator_delete((void *)local_90,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  local_198._M_dataplus._M_p = (pointer)local_f8.units_;
  bVar6 = unit::operator==((unit *)&local_198,(unit *)&one);
  uVar9 = local_128.units_;
  if (bVar6) {
LAB_001766d7:
    local_168.uncertainty_ = (float)local_128.value_;
    local_168.value_ = (float)local_f8.value_;
    local_168.units_ = uVar9;
  }
  else {
    local_198._M_dataplus._M_p = (pointer)local_128.units_;
    bVar6 = unit::operator==((unit *)&local_198,(unit *)&one);
    uVar9 = local_f8.units_;
    if (bVar6) goto LAB_001766d7;
    uncertain_measurement::uncertain_measurement(&local_168,&local_f8,&local_128);
  }
  if ((unit_data *)local_118.value_ != &local_118.units_.base_units_) {
    operator_delete((void *)local_118.value_,local_118.units_._8_8_ + 1);
  }
  if ((unit_data *)local_148.value_ != &local_148.units_.base_units_) {
    operator_delete((void *)local_148.value_,local_148.units_._8_8_ + 1);
  }
  if (!bVar13) goto LAB_001768a1;
LAB_0017673a:
  uVar10 = std::__cxx11::string::find((char)measurement_string,0x28);
  if ((uVar10 - 2 < 0xfffffffffffffffd) &&
     (lVar7 = std::__cxx11::string::find((char)measurement_string,0x29), (lVar7 - uVar10) - 2 < 3))
  {
    iVar12 = (int)uVar10;
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    if ((byte)(pcVar3[(long)iVar12 + -1] - 0x3aU) < 0xf6) goto LAB_0017678f;
    local_148.value_ = (double)&local_148.units_.base_units_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar3,pcVar3 + measurement_string->_M_string_length);
    if (0 < iVar12) {
      uVar11 = lVar7 - 1;
      lVar7 = ((long)iVar12 - 1U & 0xffffffff) + 1;
      do {
        pcVar3 = (measurement_string->_M_dataplus)._M_p;
        if ((byte)(pcVar3[lVar7 + -1] - 0x30U) < 10) {
          if (uVar10 < uVar11) {
            ((undefined1 *)((long)local_148.value_ + -1))[lVar7] = pcVar3[uVar11];
            uVar11 = uVar11 - 1;
          }
          else {
            ((undefined1 *)((long)local_148.value_ + -1))[lVar7] = 0x30;
          }
        }
        lVar8 = lVar7 + -1;
        bVar13 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar13);
    }
    puVar2 = &local_118.units_.base_units_;
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    local_118.value_ = (double)puVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar3,pcVar3 + measurement_string->_M_string_length);
    std::__cxx11::string::erase((ulong)&local_118,uVar10);
    local_b0 = (unit)&local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_118.value_,
               (undefined1 *)((long)local_118.units_.multiplier_ + (long)local_118.value_));
    paVar1 = &local_198.field_2;
    if (local_b0 == (unit)&local_a0) {
      local_198.field_2._8_8_ = local_a0._8_8_;
      local_198._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_b0;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
    local_198.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
    local_198._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_b0 = (unit)&local_a0;
    measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
    uVar5 = local_e8.units_._8_8_;
    fVar14 = SUB84(local_e8.units_.multiplier_,0);
    uVar15 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
    uVar9 = (unit)local_e8.value_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      local_178 = (unit)local_e8.value_;
      local_150 = (unit)local_e8.units_.multiplier_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar14 = local_150.multiplier_;
      uVar15 = local_150.base_units_;
      uVar9 = local_178;
    }
    local_f8.units_ = (unit)((ulong)(uint)(float)(double)CONCAT44(uVar15,fVar14) | uVar5 << 0x20);
    local_f8.value_ = (double)uVar9;
    if (local_b0 != (unit)&local_a0) {
      operator_delete((void *)local_b0,
                      CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::erase((ulong)&local_148,uVar10);
    local_d0 = (unit)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_148.value_,
               (undefined1 *)((long)local_148.units_.multiplier_ + (long)local_148.value_));
    if (local_d0 == (unit)&local_c0) {
      local_198.field_2._8_8_ = uStack_b8;
      local_198._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_d0;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = uStack_bf;
    local_198.field_2._M_local_buf[0] = local_c0;
    local_198._M_string_length = local_c8;
    local_c8 = 0;
    local_c0 = 0;
    local_d0 = (unit)&local_c0;
    measurement_from_string(&local_e8,&local_198,(uint64_t)local_170);
    fVar14 = SUB84(local_e8.units_.multiplier_,0);
    uVar15 = SUB84((ulong)local_e8.units_.multiplier_ >> 0x20,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      local_170 = (unit)local_e8.value_;
      local_178 = (unit)local_e8.units_.multiplier_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar14 = local_178.multiplier_;
      uVar15 = local_178.base_units_;
      local_e8.value_ = (double)local_170;
    }
    local_128.units_ =
         (unit)((ulong)(uint)(float)(double)CONCAT44(uVar15,fVar14) | local_e8.units_._8_8_ << 0x20)
    ;
    local_128.value_ = local_e8.value_;
    if (local_d0 != (unit)&local_c0) {
      operator_delete((void *)local_d0,CONCAT71(uStack_bf,local_c0) + 1);
    }
    uncertain_measurement::uncertain_measurement(&local_168,&local_f8,&local_128);
    if ((unit_data *)local_118.value_ != puVar2) {
      operator_delete((void *)local_118.value_,local_118.units_._8_8_ + 1);
    }
    uVar9 = (unit)local_148.value_;
    if ((unit_data *)local_148.value_ == &local_148.units_.base_units_) goto LAB_001768a1;
  }
  else {
LAB_0017678f:
    pcVar3 = (measurement_string->_M_dataplus)._M_p;
    local_50 = (unit)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + measurement_string->_M_string_length);
    if (local_50 == (unit)&local_40) {
      local_198.field_2._8_8_ = local_40._8_8_;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198._M_dataplus._M_p = (pointer)local_50;
    }
    local_198.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
    local_198.field_2._M_local_buf[0] = local_40._M_local_buf[0];
    local_198._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50 = (unit)&local_40;
    measurement_from_string(&local_148,&local_198,(uint64_t)local_170);
    fVar14 = SUB84(local_148.units_.multiplier_,0);
    uVar15 = SUB84((ulong)local_148.units_.multiplier_ >> 0x20,0);
    uVar9 = (unit)local_148.value_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      local_170 = (unit)local_148.value_;
      local_178 = (unit)local_148.units_.multiplier_;
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      fVar14 = local_178.multiplier_;
      uVar15 = local_178.base_units_;
      uVar9 = local_170;
    }
    local_168.units_ =
         (unit)((ulong)(uint)(float)(double)CONCAT44(uVar15,fVar14) | local_148.units_._8_8_ << 0x20
               );
    local_168.value_ = (float)(double)uVar9;
    local_168.uncertainty_ = 0.0;
    if (local_50 == (unit)&local_40) goto LAB_001768a1;
    local_148.units_._8_8_ = CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0])
    ;
    uVar9 = local_50;
  }
  operator_delete((void *)uVar9,local_148.units_._8_8_ + 1);
LAB_001768a1:
  uVar4.uncertainty_ = local_168.uncertainty_;
  uVar4.value_ = local_168.value_;
  uVar4.units_ = local_168.units_;
  return uVar4;
}

Assistant:

uncertain_measurement uncertain_measurement_from_string(
    const std::string& measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // first task is to find the +/-
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<const char*, 9> pmsequences{
        {"+/-",
         "\xB1",
         u8"\u00B1",
         "&plusmn;",
         "+-",
         "<u>+</u>",
         "&#xB1;",
         "&pm;",
         " \\pm "}};

    for (const auto* pmseq : pmsequences) {
        auto loc = measurement_string.find(pmseq);
        if (loc != std::string::npos) {
            auto p1 = measurement_string.substr(0, loc);
            auto m1 = measurement_cast_from_string(p1, match_flags);
            auto p2 = measurement_string.substr(loc + strlen(pmseq));
            auto m2 = measurement_cast_from_string(p2, match_flags);
            if (m1.units() == one) {
                return uncertain_measurement(
                    m1.value(), m2.value(), unit_cast(m2.units()));
            }
            if (m2.units() == one) {
                return uncertain_measurement(m1, m2.value());
            }
            return uncertain_measurement(m1, m2);
        }
    }
    // check for consise form of uncertainty X.XXXXXX(UU) N
    auto loc = measurement_string.find_first_of('(');
    if (loc < std::string::npos && loc > 1) {
        auto eloc = measurement_string.find_first_of(')', loc + 1);
        auto diff = eloc - loc;
        if (diff >= 2 && diff <= 4) {
            int cloc = static_cast<int>(loc) - 1;
            auto lc = eloc - 1;
            char c = measurement_string[cloc];
            if (c >= '0' && c <= '9') {
                std::string ustring = measurement_string;
                while (cloc >= 0) {
                    c = measurement_string[cloc];
                    if (c >= '0' && c <= '9') {
                        if (lc > loc) {
                            ustring[cloc] = measurement_string[lc];
                            --lc;
                        } else {
                            ustring[cloc] = '0';
                        }
                    }
                    --cloc;
                }
                std::string p = measurement_string;
                p.erase(loc, diff + 1);
                auto m1 = measurement_cast_from_string(p, match_flags);
                ustring.erase(loc, diff + 1);
                auto u1 = measurement_cast_from_string(ustring, match_flags);
                return uncertain_measurement(m1, u1);
            }
        }
    }
    return uncertain_measurement(
        measurement_cast_from_string(measurement_string, match_flags), 0.0F);
}